

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::objectivec::EnumName_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,EnumDescriptor *descriptor)

{
  EnumDescriptor *descriptor_00;
  string name;
  string prefix;
  allocator local_71;
  string local_70;
  string local_50;
  string local_30;
  
  FileClassPrefix_abi_cxx11_(&local_30,*(objectivec **)(this + 0x10),(FileDescriptor *)descriptor);
  ClassNameWorker_abi_cxx11_(&local_50,this,descriptor_00);
  std::__cxx11::string::string((string *)&local_70,"_Enum",&local_71);
  anon_unknown_0::SanitizeNameForObjC
            (__return_storage_ptr__,&local_30,&local_50,&local_70,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string EnumName(const EnumDescriptor* descriptor) {
  // 1. Enum names are used as is (style calls for CamelCase, trust it).
  // 2. Check for reserved word at the every end and then suffix things.
  //      message Fixed {
  //        message Size {...}
  //        enum Mumble {...}
  //      ...
  //      }
  //    yields Fixed_Class, Fixed_Size.
  const std::string prefix = FileClassPrefix(descriptor->file());
  const std::string name = ClassNameWorker(descriptor);
  return SanitizeNameForObjC(prefix, name, "_Enum", NULL);
}